

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

int __thiscall
QMimeBinaryProvider::matchGlobList
          (QMimeBinaryProvider *this,QMimeGlobMatchResult *result,CacheFile *cacheFile,int off,
          QString *fileName)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  byte bVar1;
  bool bVar2;
  quint32 qVar3;
  quint32 offset;
  quint32 offset_00;
  quint32 qVar4;
  uint uVar5;
  CacheFile *in_RDX;
  QMimeProviderBase *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  CaseSensitivity qtCaseSensitive;
  bool caseSensitive;
  int weight;
  int flagsAndWeight;
  int mimeTypeOffset;
  int globOffset;
  int i;
  int numGlobs;
  int numMatches;
  QLatin1StringView mimeType;
  QString pattern;
  QMimeGlobPattern glob;
  int in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  QMimeProviderBase *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  QString *mimeType_00;
  undefined7 in_stack_fffffffffffffe90;
  CaseSensitivity s;
  uint theWeight;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  QString *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  int local_12c;
  int local_124;
  QString *in_stack_ffffffffffffff18;
  QMimeGlobPattern *in_stack_ffffffffffffff20;
  QString local_d0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s = (CaseSensitivity)in_RDI;
  theWeight = (uint)((ulong)in_RDI >> 0x20);
  local_124 = 0;
  qVar3 = CacheFile::getUint32
                    ((CacheFile *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe6c);
  for (local_12c = 0; local_12c < (int)qVar3; local_12c = local_12c + 1) {
    offset = CacheFile::getUint32
                       ((CacheFile *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                        in_stack_fffffffffffffe6c);
    offset_00 = CacheFile::getUint32
                          ((CacheFile *)
                           CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                           in_stack_fffffffffffffe6c);
    qVar4 = CacheFile::getUint32
                      ((CacheFile *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       in_stack_fffffffffffffe6c);
    uVar5 = (uint)((byte)(qVar4 >> 8) & 1);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    CacheFile::getCharStar(in_RDX,offset);
    QLatin1String::QLatin1String
              ((QLatin1String *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (char *)in_stack_fffffffffffffe78);
    latin1.m_size._4_4_ = theWeight;
    latin1.m_size._0_4_ = s;
    latin1.m_data._0_4_ = in_stack_fffffffffffffea8;
    latin1.m_data._4_4_ = in_stack_fffffffffffffeac;
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),latin1
                    );
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    CacheFile::getCharStar(in_RDX,offset_00);
    QLatin1String::QLatin1String
              ((QLatin1String *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (char *)in_stack_fffffffffffffe78);
    local_b8 = local_88;
    puStack_b0 = puStack_80;
    latin1_00.m_size._4_4_ = theWeight;
    latin1_00.m_size._0_4_ = s;
    latin1_00.m_data._0_4_ = in_stack_fffffffffffffea8;
    latin1_00.m_data._4_4_ = in_stack_fffffffffffffeac;
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     latin1_00);
    bVar1 = QMimeProviderBase::isMimeTypeGlobsExcluded
                      (in_stack_fffffffffffffe78,
                       (QString *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    QString::~QString((QString *)0x8f9a7d);
    if ((bVar1 & 1) == 0) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      mimeType_00 = &local_d0;
      QString::QString((QString *)0x8f9b08);
      QMimeGlobPattern::QMimeGlobPattern
                ((QMimeGlobPattern *)CONCAT44(uVar5,in_stack_fffffffffffffeb8),
                 in_stack_fffffffffffffeb0,
                 (QString *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),theWeight,
                 s);
      QString::~QString((QString *)0x8f9b3a);
      bVar2 = QMimeGlobPattern::matchFileName(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      in_stack_fffffffffffffe84 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe84);
      if (bVar2) {
        latin1_01.m_size._4_4_ = theWeight;
        latin1_01.m_size._0_4_ = s;
        latin1_01.m_data._0_4_ = in_stack_fffffffffffffea8;
        latin1_01.m_data._4_4_ = in_stack_fffffffffffffeac;
        in_stack_fffffffffffffe78 = in_RSI;
        QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         latin1_01);
        QMimeGlobMatchResult::addMatch
                  ((QMimeGlobMatchResult *)CONCAT17(bVar1,in_stack_fffffffffffffe90),mimeType_00,
                   in_stack_fffffffffffffe84,(QString *)in_stack_fffffffffffffe78,
                   CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        QString::~QString((QString *)0x8f9bcd);
        local_124 = local_124 + 1;
      }
      QMimeGlobPattern::~QMimeGlobPattern
                ((QMimeGlobPattern *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      in_stack_fffffffffffffea8 = 0;
    }
    else {
      in_stack_fffffffffffffea8 = 4;
    }
    QString::~QString((QString *)0x8f9c55);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_124;
  }
  __stack_chk_fail();
}

Assistant:

int QMimeBinaryProvider::matchGlobList(QMimeGlobMatchResult &result, CacheFile *cacheFile, int off,
                                       const QString &fileName)
{
    int numMatches = 0;
    const int numGlobs = cacheFile->getUint32(off);
    //qDebug() << "Loading" << numGlobs << "globs from" << cacheFile->file.fileName() << "at offset" << cacheFile->globListOffset;
    for (int i = 0; i < numGlobs; ++i) {
        const int globOffset = cacheFile->getUint32(off + 4 + 12 * i);
        const int mimeTypeOffset = cacheFile->getUint32(off + 4 + 12 * i + 4);
        const int flagsAndWeight = cacheFile->getUint32(off + 4 + 12 * i + 8);
        const int weight = flagsAndWeight & 0xff;
        const bool caseSensitive = flagsAndWeight & 0x100;
        const Qt::CaseSensitivity qtCaseSensitive = caseSensitive ? Qt::CaseSensitive : Qt::CaseInsensitive;
        const QString pattern = QLatin1StringView(cacheFile->getCharStar(globOffset));

        const QLatin1StringView mimeType(cacheFile->getCharStar(mimeTypeOffset));
        //qDebug() << pattern << mimeType << weight << caseSensitive;
        if (isMimeTypeGlobsExcluded(mimeType))
            continue;

        QMimeGlobPattern glob(pattern, QString() /*unused*/, weight, qtCaseSensitive);
        if (glob.matchFileName(fileName)) {
            result.addMatch(mimeType, weight, pattern);
            ++numMatches;
        }
    }
    return numMatches;
}